

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

void Abc_SclPrintFaninPairs(SC_Man *p,Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  pVVar1 = pNtk->vObjs;
  if (0 < pVVar1->nSize) {
    lVar4 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar1->pArray[lVar4];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        iVar2 = (pObj->vFanins).nSize;
        if (0 < iVar2) {
          lVar3 = 0;
          do {
            pFanin = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]];
            if (((*(uint *)&pFanin->field_0x14 & 0xf) == 7) && ((pFanin->vFanouts).nSize == 1)) {
              Abc_SclCheckCommonInputs(pObj,pFanin);
              iVar2 = (pObj->vFanins).nSize;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < iVar2);
          pVVar1 = pNtk->vObjs;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Abc_SclPrintFaninPairs( SC_Man * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( Abc_ObjIsNode(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
                Abc_SclCheckCommonInputs( pObj, pFanin );
}